

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

void write_file(path *path,string *data)

{
  int iVar1;
  ContextManager *pCVar2;
  ssize_t sVar3;
  string local_48;
  
  iVar1 = open(*(char **)path,1);
  if (iVar1 < 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_48,"Cannot open file \'%s\' for writing: %m",*(undefined8 *)path);
    (*(code *)**(undefined8 **)pCVar2)(pCVar2,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  sVar3 = write(iVar1,(data->_M_dataplus)._M_p,data->_M_string_length);
  if (((int)(uint)sVar3 < 0) || ((ulong)((uint)sVar3 & 0x7fffffff) != data->_M_string_length)) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_48,"Cannot write to file \'%s\': %m",*(undefined8 *)path);
    (*(code *)**(undefined8 **)pCVar2)(pCVar2,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = close(iVar1);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_48,"Cannot close file \'%s\': %m",*(undefined8 *)path);
    (*(code *)**(undefined8 **)pCVar2)(pCVar2,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void write_file(const fs::path &path, const std::string &data) {
    fd_t fd = open(path.c_str(), O_WRONLY);
    if (fd < 0) {
        die(format("Cannot open file '%s' for writing: %m", path.c_str()));
    }
    int cnt = write(fd, data.c_str(), data.size());
    if (cnt < 0 || static_cast<size_t>(cnt) != data.size()) {
        die(format("Cannot write to file '%s': %m", path.c_str()));
    }
    if (close(fd) != 0) {
        die(format("Cannot close file '%s': %m", path.c_str()));
    }
}